

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_point.cpp
# Opt level: O1

int ON_ParsePointExpression
              (wchar_t *str,int str_count,AngleUnitSystem default_str_angle_unit_system,
              LengthUnitSystem point_value_unit_system,ON_3dPoint *point_value)

{
  ON_ParseSettings parse_settings;
  int iVar1;
  ON_ParseSettings ps;
  ON_ParseSettings local_48;
  
  local_48._16_8_ = ON_ParseSettings::DefaultSettingsInRadians._16_8_;
  local_48.m_reserved = ON_ParseSettings::DefaultSettingsInRadians.m_reserved;
  local_48.m_true_default_bits = ON_ParseSettings::DefaultSettingsInRadians.m_true_default_bits;
  local_48.m_false_default_bits = ON_ParseSettings::DefaultSettingsInRadians.m_false_default_bits;
  ON_ParseSettings::SetDefaultAngleUnitSystem(&local_48,default_str_angle_unit_system);
  parse_settings.m_false_default_bits[0] = local_48.m_false_default_bits[0];
  parse_settings.m_false_default_bits[1] = local_48.m_false_default_bits[1];
  parse_settings.m_true_default_bits[0] = local_48.m_true_default_bits[0];
  parse_settings.m_true_default_bits[1] = local_48.m_true_default_bits[1];
  parse_settings.m_reserved_bits = local_48.m_reserved_bits;
  parse_settings.m_context_locale_id = local_48.m_context_locale_id;
  parse_settings.m_context_angle_unit_system = local_48.m_context_angle_unit_system;
  parse_settings.m_context_length_unit_system = local_48.m_context_length_unit_system;
  parse_settings.m_reserved = local_48.m_reserved;
  iVar1 = ON_ParsePointExpression
                    (str,str_count,parse_settings,point_value_unit_system,point_value,
                     (ON_ParseSettings *)0x0);
  return iVar1;
}

Assistant:

int ON_ParsePointExpression(
  const wchar_t* str,
  int str_count,
  ON::AngleUnitSystem default_str_angle_unit_system,
  ON::LengthUnitSystem point_value_unit_system,
  ON_3dPoint* point_value
  )
{
  ON_ParseSettings ps(ON_ParseSettings::DefaultSettingsInRadians);
  ps.SetDefaultAngleUnitSystem(default_str_angle_unit_system);
  return ON_ParsePointExpression(
    str,str_count,
    ps,
    point_value_unit_system,point_value,
    0);
}